

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  FastText fasttext;
  int32_t k;
  string *in_stack_000001b8;
  FastText *in_stack_000001c0;
  string *in_stack_ffffffffffffff30;
  string local_c0 [48];
  FastText *in_stack_ffffffffffffff70;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 != 3) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar1 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,3);
    std::__cxx11::stoi(in_stack_ffffffffffffff30,(size_t *)in_RDI,0);
  }
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff70);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_c0,(string *)pvVar2);
  ::fasttext::FastText::loadModel(in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string(local_c0);
  ::fasttext::FastText::analogies
            ((FastText *)fasttext._120_8_,fasttext.tokenCount_.super___atomic_base<long>._M_i._4_4_)
  ;
  exit(0);
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  fasttext.analogies(k);
  exit(0);
}